

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::handleNestedDefinition(Scope *this,ModuleDeclarationSyntax *syntax)

{
  bool bVar1;
  ModuleHeaderSyntax *pMVar2;
  DefinitionSymbol *this_00;
  size_t sVar3;
  Symbol *inst;
  DefinitionSymbol *def;
  ModuleHeaderSyntax *header;
  Scope *in_stack_00000038;
  ModuleDeclarationSyntax *in_stack_00000208;
  Scope *in_stack_00000210;
  Compilation *in_stack_00000218;
  ModuleDeclarationSyntax *in_stack_000002a8;
  Scope *in_stack_000002b0;
  
  pMVar2 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator*
                     ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x6771f6);
  if ((pMVar2->parameters == (ParameterPortListSyntax *)0x0) ||
     (bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::
              empty((SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)0x67721f),
     bVar1)) {
    if (pMVar2->ports != (PortListSyntax *)0x0) {
      if ((pMVar2->ports->super_SyntaxNode).kind == AnsiPortList) {
        slang::syntax::SyntaxNode::as<slang::syntax::AnsiPortListSyntax>
                  (&pMVar2->ports->super_SyntaxNode);
        bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::empty
                          ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x677265);
      }
      else {
        if ((pMVar2->ports->super_SyntaxNode).kind != NonAnsiPortList) {
          return;
        }
        slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiPortListSyntax>
                  (&pMVar2->ports->super_SyntaxNode);
        bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::empty
                          ((SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)0x6772a1);
      }
      if (!bVar1) {
        return;
      }
    }
    this_00 = Compilation::getDefinition(in_stack_00000218,in_stack_00000210,in_stack_00000208);
    if ((this_00 != (DefinitionSymbol *)0x0) &&
       (sVar3 = DefinitionSymbol::getInstanceCount(this_00), sVar3 == 0)) {
      InstanceSymbol::createDefaultNested(in_stack_000002b0,in_stack_000002a8);
      insertMember(in_stack_00000038,(Symbol *)this,(Symbol *)syntax,header._7_1_,header._6_1_);
    }
  }
  return;
}

Assistant:

void Scope::handleNestedDefinition(const ModuleDeclarationSyntax& syntax) const {
    // We implicitly instantiate this definition if it has no parameters
    // and no ports and hasn't been instantiated elsewhere.
    auto& header = *syntax.header;
    if (header.parameters && !header.parameters->declarations.empty())
        return;

    if (header.ports) {
        if (header.ports->kind == SyntaxKind::AnsiPortList) {
            if (!header.ports->as<AnsiPortListSyntax>().ports.empty())
                return;
        }
        else if (header.ports->kind == SyntaxKind::NonAnsiPortList) {
            if (!header.ports->as<NonAnsiPortListSyntax>().ports.empty())
                return;
        }
        else {
            return;
        }
    }

    auto def = compilation.getDefinition(*this, syntax);
    if (!def || def->getInstanceCount() > 0)
        return;

    auto& inst = InstanceSymbol::createDefaultNested(*this, syntax);
    insertMember(&inst, lastMember, /* isElaborating */ true, /* incrementIndex */ true);
}